

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_mutex.c
# Opt level: O1

int s_mutex_lock(s_awaiter_t *__awaiter_dummy__,s_mutex_t *mutex)

{
  int iVar1;
  long *in_FS_OFFSET;
  
  if (mutex->locked == true) {
    iVar1 = s_list_is_empty(&mutex->wait_list);
    if (iVar1 != 0) {
      s_list_detach(&mutex->self);
      s_list_attach((s_list_t *)(*in_FS_OFFSET + -0x20),&mutex->self);
    }
    s_list_detach((s_list_t *)in_FS_OFFSET[-8]);
    s_list_attach(&mutex->wait_list,(s_list_t *)in_FS_OFFSET[-8]);
    s_task_next(__awaiter_dummy__);
    iVar1 = -(uint)*(byte *)(in_FS_OFFSET[-8] + 0x50);
    *(undefined1 *)(in_FS_OFFSET[-8] + 0x50) = 0;
  }
  else {
    mutex->locked = true;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int s_mutex_lock(__async__, s_mutex_t *mutex) {
    if(mutex->locked) {
        int ret;
        /* Put current task to the mutex's waiting list */
        s_mutex_add_to_waiting_list(mutex);
        s_list_detach(&g_globals.current_task->node);   /* no need, for safe */
        s_list_attach(&mutex->wait_list, &g_globals.current_task->node);
        s_task_next(__await__);

        ret = (g_globals.current_task->waiting_cancelled ? -1 : 0);
        g_globals.current_task->waiting_cancelled = false;
        return ret;
    }
    else {
        mutex->locked = true;
        return 0;
    }
}